

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::~cmake(cmake *this)

{
  cmState *this_00;
  cmVariableWatch *this_01;
  cmFileTimeComparison *this_02;
  cmake *this_local;
  
  this_00 = this->State;
  if (this_00 != (cmState *)0x0) {
    cmState::~cmState(this_00);
    operator_delete(this_00,0x218);
  }
  if (this->Messenger != (cmMessenger *)0x0) {
    operator_delete(this->Messenger,8);
  }
  if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
    }
    this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  }
  cmDeleteAll<std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>>
            (&this->Generators);
  if (this->Debugger != (cmDebugger *)0x0) {
    (*this->Debugger->_vptr_cmDebugger[0xb])();
  }
  this_01 = this->VariableWatch;
  if (this_01 != (cmVariableWatch *)0x0) {
    cmVariableWatch::~cmVariableWatch(this_01);
    operator_delete(this_01,0x30);
  }
  this_02 = this->FileComparison;
  if (this_02 != (cmFileTimeComparison *)0x0) {
    cmFileTimeComparison::~cmFileTimeComparison(this_02);
    operator_delete(this_02,8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->TraceOnlyThisSources);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
  ::~map(&this->InstalledFiles);
  std::__cxx11::string::~string((string *)&this->GraphVizFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->HeaderFileExtensions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->SourceFileExtensions);
  std::__cxx11::string::~string((string *)&this->VSSolutionFile);
  std::__cxx11::string::~string((string *)&this->CheckStampList);
  std::__cxx11::string::~string((string *)&this->CheckStampFile);
  std::__cxx11::string::~string((string *)&this->CheckBuildSystemArgument);
  std::__cxx11::string::~string((string *)&this->CCEnvironment);
  std::__cxx11::string::~string((string *)&this->CXXEnvironment);
  std::__cxx11::string::~string((string *)&this->CMakeEditCommand);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map(&this->UsedCliVariables);
  std::__cxx11::string::~string((string *)&this->GeneratorToolset);
  std::__cxx11::string::~string((string *)&this->GeneratorPlatform);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  ::~map(&this->DiagLevels);
  std::
  vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ::~vector(&this->ExtraGenerators);
  std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::~vector
            (&this->Generators);
  return;
}

Assistant:

cmake::~cmake()
{
  delete this->State;
  delete this->Messenger;
  if (this->GlobalGenerator) {
    delete this->GlobalGenerator;
    this->GlobalGenerator = CM_NULLPTR;
  }
  cmDeleteAll(this->Generators);
  delete this->Debugger;
#ifdef CMAKE_BUILD_WITH_CMAKE
  delete this->VariableWatch;
#endif
  delete this->FileComparison;
}